

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptor.cpp
# Opt level: O3

void __thiscall FIX::SocketAcceptor::onStart(SocketAcceptor *this)

{
  Strategy *strategy;
  bool bVar1;
  time_t tVar2;
  int __fd;
  Strategy *in_RSI;
  SocketServer *pSVar3;
  time_t start;
  time_t now;
  time_t local_28 [2];
  
  strategy = &this->super_Strategy;
  do {
    pSVar3 = this->m_pServer;
    if (((this->super_Acceptor).m_stop._M_base._M_i & 1U) != 0) goto LAB_001b7629;
    if (pSVar3 == (SocketServer *)0x0) {
      return;
    }
    in_RSI = strategy;
    bVar1 = SocketServer::block(pSVar3,strategy,false,0.0);
  } while (bVar1);
  pSVar3 = this->m_pServer;
LAB_001b7629:
  if (pSVar3 != (SocketServer *)0x0) {
    local_28[0] = 0;
    local_28[1] = 0;
    time(local_28);
    do {
      __fd = (int)in_RSI;
      bVar1 = Acceptor::isLoggedOn(&this->super_Acceptor);
      if (!bVar1) break;
      in_RSI = strategy;
      SocketServer::block(this->m_pServer,strategy,false,0.0);
      tVar2 = time(local_28 + 1);
      __fd = (int)in_RSI;
    } while (tVar2 + -5 < local_28[0]);
    SocketServer::close(this->m_pServer,__fd);
    pSVar3 = this->m_pServer;
    if (pSVar3 != (SocketServer *)0x0) {
      SocketMonitor::~SocketMonitor(&pSVar3->m_monitor);
      std::
      _Rb_tree<int,_std::pair<const_int,_FIX::SocketInfo>,_std::_Select1st<std::pair<const_int,_FIX::SocketInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
      ::~_Rb_tree(&(pSVar3->m_portToInfo)._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_FIX::SocketInfo>,_std::_Select1st<std::pair<const_int,_FIX::SocketInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_FIX::SocketInfo>,_std::_Select1st<std::pair<const_int,_FIX::SocketInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
                   *)pSVar3);
    }
    operator_delete(pSVar3,0x160);
    this->m_pServer = (SocketServer *)0x0;
  }
  return;
}

Assistant:

void SocketAcceptor::onStart() {
  while (!isStopped() && m_pServer && m_pServer->block(*this)) {}

  if (!m_pServer) {
    return;
  }

  time_t start = 0;
  time_t now = 0;

  ::time(&start);
  while (isLoggedOn()) {
    m_pServer->block(*this);
    if (::time(&now) - 5 >= start) {
      break;
    }
  }

  m_pServer->close();
  delete m_pServer;
  m_pServer = 0;
}